

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

HasSizeMatcher * Catch::Matchers::SizeIs(size_t sz)

{
  HasSizeMatcher *in_RDI;
  
  (in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString.
                 field_2;
  (in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf
  [0] = '\0';
  (in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherGenericBase_001faf08;
  in_RDI->m_target_size = sz;
  return in_RDI;
}

Assistant:

HasSizeMatcher SizeIs(std::size_t sz) {
            return HasSizeMatcher{ sz };
        }